

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O0

size_t burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                 (TSTNode<unsigned_short> *node,uchar **strings,size_t pos,size_t depth)

{
  size_t sVar1;
  size_t depth_local;
  size_t pos_local;
  uchar **strings_local;
  TSTNode<unsigned_short> *node_local;
  
  sVar1 = handle_bucket<0u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                    (node,strings,pos,depth);
  sVar1 = handle_bucket<1u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                    (node,strings,sVar1,depth);
  sVar1 = handle_bucket<2u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                    (node,strings,sVar1,depth);
  return sVar1;
}

Assistant:

static inline size_t
burst_traverse(TSTNode<CharT>* node,
               unsigned char** strings,
               size_t pos,
               size_t depth)
{
	pos = handle_bucket<0, BucketT>(node, strings, pos, depth);
	pos = handle_bucket<1, BucketT>(node, strings, pos, depth);
	pos = handle_bucket<2, BucketT>(node, strings, pos, depth);
	return pos;
}